

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load(elfio *this,istream *stream,bool is_lazy)

{
  uchar encoding;
  istream *piVar1;
  bool bVar2;
  uint uVar3;
  pointer pvVar4;
  long lVar5;
  reference pvVar6;
  uchar *puVar7;
  pointer peVar8;
  undefined1 local_60 [7];
  bool is_still_good;
  streampos local_58;
  streampos local_48;
  undefined1 local_31 [8];
  array<char,_16UL> e_ident;
  bool is_lazy_local;
  istream *stream_local;
  elfio *this_local;
  
  e_ident._M_elems[8] = is_lazy;
  unique0x10000352 = stream;
  std::
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ::clear(&this->sections_);
  std::
  vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ::clear(&this->segments_);
  memset(local_31,0,0x10);
  piVar1 = stack0xffffffffffffffe0;
  std::fpos<__mbstate_t>::fpos(&local_58,0);
  local_48 = address_translator::operator[](&this->addr_translator,local_58);
  std::istream::seekg(piVar1,local_48._M_off,local_48._M_state);
  piVar1 = stack0xffffffffffffffe0;
  pvVar4 = std::array<char,_16UL>::data((array<char,_16UL> *)local_31);
  std::istream::read((char *)piVar1,(long)pvVar4);
  lVar5 = std::istream::gcount();
  if ((((lVar5 != 0x10) ||
       (pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,0),
       *pvVar6 != '\x7f')) ||
      (pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,1), *pvVar6 != 'E')
      ) || ((pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,2),
            *pvVar6 != 'L' ||
            (pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,3),
            *pvVar6 != 'F')))) {
    return false;
  }
  pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,4);
  if ((*pvVar6 != '\x02') &&
     (pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,4),
     *pvVar6 != '\x01')) {
    return false;
  }
  pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,5);
  if ((*pvVar6 != '\x01') &&
     (pvVar6 = std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,5),
     *pvVar6 != '\x02')) {
    return false;
  }
  puVar7 = (uchar *)std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,5);
  endianness_convertor::setup(&this->convertor,*puVar7);
  puVar7 = (uchar *)std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,4);
  encoding = *puVar7;
  std::array<char,_16UL>::operator[]((array<char,_16UL> *)local_31,5);
  create_header((elfio *)local_60,(uchar)this,encoding);
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator=
            (&this->header,
             (unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> *)local_60);
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::~unique_ptr
            ((unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> *)local_60);
  bVar2 = std::operator==((nullptr_t)0x0,&this->header);
  if (bVar2) {
    return false;
  }
  peVar8 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  uVar3 = (*peVar8->_vptr_elf_header[2])(peVar8,stack0xffffffffffffffe0);
  if ((uVar3 & 1) == 0) {
    return false;
  }
  load_sections(this,stack0xffffffffffffffe0,(bool)(e_ident._M_elems[8] & 1));
  bVar2 = load_segments(this,stack0xffffffffffffffe0,(bool)(e_ident._M_elems[8] & 1));
  return bVar2;
}

Assistant:

bool load( std::istream& stream, bool is_lazy = false )
    {
        sections_.clear();
        segments_.clear();

        std::array<char, EI_NIDENT> e_ident = { 0 };
        // Read ELF file signature
        stream.seekg( addr_translator[0] );
        stream.read( e_ident.data(), sizeof( e_ident ) );

        // Is it ELF file?
        if ( stream.gcount() != sizeof( e_ident ) ||
             e_ident[EI_MAG0] != ELFMAG0 || e_ident[EI_MAG1] != ELFMAG1 ||
             e_ident[EI_MAG2] != ELFMAG2 || e_ident[EI_MAG3] != ELFMAG3 ) {
            return false;
        }

        if ( ( e_ident[EI_CLASS] != ELFCLASS64 ) &&
             ( e_ident[EI_CLASS] != ELFCLASS32 ) ) {
            return false;
        }

        if ( ( e_ident[EI_DATA] != ELFDATA2LSB ) &&
             ( e_ident[EI_DATA] != ELFDATA2MSB ) ) {
            return false;
        }

        convertor.setup( e_ident[EI_DATA] );
        header = create_header( e_ident[EI_CLASS], e_ident[EI_DATA] );
        if ( nullptr == header ) {
            return false;
        }
        if ( !header->load( stream ) ) {
            return false;
        }

        load_sections( stream, is_lazy );
        bool is_still_good = load_segments( stream, is_lazy );
        return is_still_good;
    }